

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

vector<Range,_std::allocator<Range>_> *
getAllExclusions(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Rules *rules,
                Range *range)

{
  string *key;
  pointer limits;
  bool bVar1;
  size_type sVar2;
  reference __x;
  reference pvVar3;
  vector<Range,_std::allocator<Range>_> local_3d8;
  value_type *local_3c0;
  Range *r_2;
  iterator __end3;
  iterator __begin3;
  vector<Range,_std::allocator<Range>_> *__range3;
  reference local_370;
  Exclusion *exclusion_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Exclusion,_std::allocator<Exclusion>_> *__range1_2;
  vector<Range,_std::allocator<Range>_> exclusionRanges;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  vector<Range,_std::allocator<Range>_> local_290;
  reference local_278;
  Range *r_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<Range,_std::allocator<Range>_> *__range4_1;
  Range *r;
  iterator __end4;
  iterator __begin4;
  vector<Range,_std::allocator<Range>_> *__range4;
  reference local_1f0;
  Exclusion *exclusion;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Exclusion,_std::allocator<Exclusion>_> *__range1_1;
  vector<Range,_std::allocator<Range>_> daysOff;
  vector<Range,_std::allocator<Range>_> daysOn;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  string local_110;
  string *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1;
  iterator __begin1;
  string local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<Exclusion,_std::allocator<Exclusion>_> exclusions;
  vector<Range,_std::allocator<Range>_> local_68;
  vector<Range,_std::allocator<Range>_> local_50;
  undefined1 local_38 [8];
  vector<Range,_std::allocator<Range>_> results;
  Range *range_local;
  Rules *rules_local;
  
  results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = range;
  std::vector<Range,_std::allocator<Range>_>::vector
            ((vector<Range,_std::allocator<Range>_> *)local_38);
  limits = results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  getHolidays(&local_68,rules);
  addRanges(&local_50,limits,(vector<Range,_std::allocator<Range>_> *)local_38,&local_68);
  std::vector<Range,_std::allocator<Range>_>::operator=
            ((vector<Range,_std::allocator<Range>_> *)local_38,&local_50);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_50);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_68);
  std::vector<Exclusion,_std::allocator<Exclusion>_>::vector
            ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"exclusions.",(allocator<char> *)((long)&__begin1._M_current + 7));
  Rules::all(&local_b0,rules,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1._M_current + 7));
  local_98 = &local_b0;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_98);
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name), bVar1) {
    local_f0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    lowerCase(&local_110,local_f0);
    key = local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
    Rules::get(&local_130,rules,key,&local_150);
    std::vector<Exclusion,std::allocator<Exclusion>>::
    emplace_back<std::__cxx11::string,std::__cxx11::string>
              ((vector<Exclusion,std::allocator<Exclusion>> *)&__range1,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_110);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Found {1} exclusions",
             (allocator<char> *)
             ((long)&daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::vector<Exclusion,_std::allocator<Exclusion>_>::size
                    ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  format<unsigned_long>(&local_178,&local_198,sVar2);
  debug(&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<Range,_std::allocator<Range>_>::vector
            ((vector<Range,_std::allocator<Range>_> *)
             &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Range,_std::allocator<Range>_>::vector
            ((vector<Range,_std::allocator<Range>_> *)&__range1_1);
  __end1_1 = std::vector<Exclusion,_std::allocator<Exclusion>_>::begin
                       ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  exclusion = (Exclusion *)
              std::vector<Exclusion,_std::allocator<Exclusion>_>::end
                        ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>
                             *)&exclusion), bVar1) {
    local_1f0 = __gnu_cxx::
                __normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>
                ::operator*(&__end1_1);
    Exclusion::tokens_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range4,local_1f0);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range4,1);
    bVar1 = std::operator==(pvVar3,"day");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range4);
    if (bVar1) {
      bVar1 = Exclusion::additive(local_1f0);
      if (bVar1) {
        Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)&__begin4,local_1f0,
                          results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        __end4 = std::vector<Range,_std::allocator<Range>_>::begin
                           ((vector<Range,_std::allocator<Range>_> *)&__begin4);
        r = (Range *)std::vector<Range,_std::allocator<Range>_>::end
                               ((vector<Range,_std::allocator<Range>_> *)&__begin4);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                           *)&r), bVar1) {
          __x = __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
                operator*(&__end4);
          std::vector<Range,_std::allocator<Range>_>::push_back
                    ((vector<Range,_std::allocator<Range>_> *)
                     &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,__x);
          __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
          operator++(&__end4);
        }
        std::vector<Range,_std::allocator<Range>_>::~vector
                  ((vector<Range,_std::allocator<Range>_> *)&__begin4);
      }
      else {
        Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)&__begin4_1,local_1f0,
                          results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        __end4_1 = std::vector<Range,_std::allocator<Range>_>::begin
                             ((vector<Range,_std::allocator<Range>_> *)&__begin4_1);
        r_1 = (Range *)std::vector<Range,_std::allocator<Range>_>::end
                                 ((vector<Range,_std::allocator<Range>_> *)&__begin4_1);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                   *)&r_1), bVar1) {
          local_278 = __gnu_cxx::
                      __normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
                      operator*(&__end4_1);
          std::vector<Range,_std::allocator<Range>_>::push_back
                    ((vector<Range,_std::allocator<Range>_> *)&__range1_1,local_278);
          __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
          operator++(&__end4_1);
        }
        std::vector<Range,_std::allocator<Range>_>::~vector
                  ((vector<Range,_std::allocator<Range>_> *)&__begin4_1);
      }
    }
    __gnu_cxx::__normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>::
    operator++(&__end1_1);
  }
  addRanges(&local_290,
            results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,
            (vector<Range,_std::allocator<Range>_> *)local_38,
            (vector<Range,_std::allocator<Range>_> *)&__range1_1);
  std::vector<Range,_std::allocator<Range>_>::operator=
            ((vector<Range,_std::allocator<Range>_> *)local_38,&local_290);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_290);
  bVar1 = std::vector<Range,_std::allocator<Range>_>::empty
                    ((vector<Range,_std::allocator<Range>_> *)
                     &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"Found {1} additional working days",&local_2d1);
    sVar2 = std::vector<Range,_std::allocator<Range>_>::size
                      ((vector<Range,_std::allocator<Range>_> *)
                       &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    format<unsigned_long>(&local_2b0,&local_2d0,sVar2);
    debug(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  bVar1 = std::vector<Range,_std::allocator<Range>_>::empty
                    ((vector<Range,_std::allocator<Range>_> *)&__range1_1);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"Found {1} additional non-working days",&local_319);
    sVar2 = std::vector<Range,_std::allocator<Range>_>::size
                      ((vector<Range,_std::allocator<Range>_> *)&__range1_1);
    format<unsigned_long>(&local_2f8,&local_318,sVar2);
    debug(&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  subtractRanges((vector<Range,_std::allocator<Range>_> *)
                 &exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<Range,_std::allocator<Range>_> *)local_38,
                 (vector<Range,_std::allocator<Range>_> *)
                 &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<Range,_std::allocator<Range>_>::operator=
            ((vector<Range,_std::allocator<Range>_> *)local_38,
             (vector<Range,_std::allocator<Range>_> *)
             &exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)
             &exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Range,_std::allocator<Range>_>::vector
            ((vector<Range,_std::allocator<Range>_> *)&__range1_2);
  __end1_2 = std::vector<Exclusion,_std::allocator<Exclusion>_>::begin
                       ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  exclusion_1 = (Exclusion *)
                std::vector<Exclusion,_std::allocator<Exclusion>_>::end
                          ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>
                             *)&exclusion_1), bVar1) {
    local_370 = __gnu_cxx::
                __normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>
                ::operator*(&__end1_2);
    Exclusion::tokens_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3,local_370);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range3,1);
    bVar1 = std::operator!=(pvVar3,"day");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    if (bVar1) {
      Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)&__begin3,local_370,
                        results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      __end3 = std::vector<Range,_std::allocator<Range>_>::begin
                         ((vector<Range,_std::allocator<Range>_> *)&__begin3);
      r_2 = (Range *)std::vector<Range,_std::allocator<Range>_>::end
                               ((vector<Range,_std::allocator<Range>_> *)&__begin3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                         *)&r_2), bVar1) {
        local_3c0 = __gnu_cxx::
                    __normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
                    operator*(&__end3);
        bVar1 = Range::is_empty(local_3c0);
        if (!bVar1) {
          std::vector<Range,_std::allocator<Range>_>::push_back
                    ((vector<Range,_std::allocator<Range>_> *)&__range1_2,local_3c0);
        }
        __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
        operator++(&__end3);
      }
      std::vector<Range,_std::allocator<Range>_>::~vector
                ((vector<Range,_std::allocator<Range>_> *)&__begin3);
    }
    __gnu_cxx::__normal_iterator<Exclusion_*,_std::vector<Exclusion,_std::allocator<Exclusion>_>_>::
    operator++(&__end1_2);
  }
  addRanges(&local_3d8,
            results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,
            (vector<Range,_std::allocator<Range>_> *)local_38,
            (vector<Range,_std::allocator<Range>_> *)&__range1_2);
  merge(__return_storage_ptr__,&local_3d8);
  std::vector<Range,_std::allocator<Range>_>::~vector(&local_3d8);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)&__range1_2);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)&__range1_1);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)
             &daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Exclusion,_std::allocator<Exclusion>_>::~vector
            ((vector<Exclusion,_std::allocator<Exclusion>_> *)&__range1);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> getAllExclusions (
  const Rules& rules,
  const Range& range)
{
  // Start with the set of all holidays, intersected with range.
  std::vector <Range> results;
  results = addRanges (range, results, getHolidays (rules));

  // Load all exclusions from configuration.
  std::vector <Exclusion> exclusions;
  for (auto& name : rules.all ("exclusions."))
    exclusions.emplace_back (lowerCase (name), rules.get (name));
  debug (format ("Found {1} exclusions", exclusions.size ()));

  // Find exclusions 'exc day on <date>' and remove from holidays.
  // Find exclusions 'exc day off <date>' and add to holidays.
  std::vector <Range> daysOn;
  std::vector <Range> daysOff;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] == "day")
    {
      if (exclusion.additive ())
        for (auto& r : exclusion.ranges (range))
          daysOn.push_back (r);
      else
        for (auto& r : exclusion.ranges (range))
          daysOff.push_back (r);
    }
  }

  // daysOff are combined with existing holidays.
  results = addRanges (range, results, daysOff);
  if (! daysOn.empty ())
    debug (format ("Found {1} additional working days", daysOn.size ()));
  if (! daysOff.empty ())
    debug (format ("Found {1} additional non-working days", daysOff.size ()));

  // daysOn are subtracted from the existing holidays.
  results = subtractRanges (results, daysOn);

  // Expand all exclusions that are not 'exc day ...' into excluded ranges that
  // overlap with range.
  std::vector <Range> exclusionRanges;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] != "day")
    {
      for (auto& r : exclusion.ranges (range))
      {
        if (! r.is_empty ())
        {
          exclusionRanges.push_back (r);
        }
      }
    }
  }

  return merge (addRanges (range, results, exclusionRanges));
}